

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lists.cc
# Opt level: O0

void __thiscall
Lists<std::shared_ptr<Eqclass>_>::prepend
          (Lists<std::shared_ptr<Eqclass>_> *this,shared_ptr<Eqclass> *item)

{
  bool bVar1;
  ListNodes<std::shared_ptr<Eqclass>_> *this_00;
  element_type *this_01;
  shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> local_70;
  undefined1 local_59;
  shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> local_58;
  shared_ptr<Eqclass> local_48 [2];
  undefined1 local_28 [8];
  shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> node;
  shared_ptr<Eqclass> *item_local;
  Lists<std::shared_ptr<Eqclass>_> *this_local;
  
  node.super___shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)item;
  std::shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_>::shared_ptr
            ((shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> *)local_28);
  this->theSize = this->theSize + 1;
  this_00 = (ListNodes<std::shared_ptr<Eqclass>_> *)operator_new(0x20);
  local_59 = 1;
  std::shared_ptr<Eqclass>::shared_ptr(local_48,item);
  std::shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_>::shared_ptr(&local_58,(nullptr_t)0x0);
  ListNodes<std::shared_ptr<Eqclass>_>::ListNodes(this_00,local_48,&local_58);
  local_59 = 0;
  std::__shared_ptr<ListNodes<std::shared_ptr<Eqclass>>,(__gnu_cxx::_Lock_policy)2>::
  reset<ListNodes<std::shared_ptr<Eqclass>>>
            ((__shared_ptr<ListNodes<std::shared_ptr<Eqclass>>,(__gnu_cxx::_Lock_policy)2> *)
             local_28,this_00);
  std::shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_>::~shared_ptr(&local_58);
  std::shared_ptr<Eqclass>::~shared_ptr(local_48);
  bVar1 = std::operator==(&this->theHead,(nullptr_t)0x0);
  if (bVar1) {
    std::shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_>::operator=
              (&this->theHead,(shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> *)local_28);
    std::shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_>::operator=
              (&this->theLast,(shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> *)local_28);
  }
  else {
    this_01 = std::
              __shared_ptr_access<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_28);
    std::shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_>::shared_ptr(&local_70,&this->theHead);
    ListNodes<std::shared_ptr<Eqclass>_>::set_next(this_01,&local_70);
    std::shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_>::~shared_ptr(&local_70);
    std::shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_>::operator=
              (&this->theHead,(shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> *)local_28);
  }
  std::shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_>::~shared_ptr
            ((shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> *)local_28);
  return;
}

Assistant:

void Lists<T>::prepend(T item) {
    shared_ptr<ListNodes<T>> node;

    theSize++;
    node.reset(new ListNodes<T>(item, 0));

    if (theHead == 0) {
        theHead = node;
        theLast = node;
    } else {
        node->set_next(theHead);
        theHead = node;
    }
}